

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

void __thiscall Js::CompoundString::BlockInfo::CopyFrom(BlockInfo *this,Block *block)

{
  CharCount CVar1;
  void *ptr;
  Block *block_local;
  BlockInfo *this_local;
  
  ptr = Block::Buffer(block);
  Memory::WriteBarrierPtr<void>::operator=(&this->buffer,ptr);
  CVar1 = Block::CharLength(block);
  this->charLength = CVar1;
  CVar1 = Block::CharCapacity(block);
  this->charCapacity = CVar1;
  return;
}

Assistant:

void CompoundString::BlockInfo::CopyFrom(Block *const block)
    {
        buffer = block->Buffer();
        charLength = block->CharLength();
        charCapacity = block->CharCapacity();
    }